

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

void __thiscall ncnn::InnerProduct::InnerProduct(InnerProduct *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__InnerProduct_001df138;
  Mat::Mat((Mat *)(in_RDI + 0x1a));
  Mat::Mat((Mat *)(in_RDI + 0x22));
  Mat::Mat((Mat *)(in_RDI + 0x2a));
  Mat::Mat((Mat *)(in_RDI + 0x32));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

InnerProduct::InnerProduct()
{
    one_blob_only = true;
    support_inplace = false;
}